

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<double>>
               (char *label_id,GetterBarV<double> *getter,double width)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar14;
  int iVar15;
  ImPlotRange *pIVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar23 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      dVar1 = getter->XShift;
      pdVar8 = getter->Ys;
      iVar15 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar5 = pIVar9->CurrentYAxis;
      uVar6 = (pIVar9->XAxis).Flags;
      pIVar16 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar9->YAxis[iVar5].Flags;
      iVar17 = 0;
      dVar20 = 0.0;
      do {
        dVar21 = dVar1 + dVar20;
        dVar2 = *(double *)
                 ((long)pdVar8 +
                 (long)(((iVar15 + iVar17) % iVar14 + iVar14) % iVar14) * (long)iVar4);
        dVar22 = dVar21 - dVar23;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f2734:
            if ((0.0 < dVar22) || ((uVar6 & 0x20) == 0)) {
              dVar10 = (pIVar12->ExtentsX).Min;
              dVar11 = (pIVar12->ExtentsX).Max;
              uVar18 = -(ulong)(dVar22 < dVar10);
              uVar19 = -(ulong)(dVar11 < dVar22);
              (pIVar12->ExtentsX).Min = (double)(~uVar18 & (ulong)dVar10 | (ulong)dVar22 & uVar18);
              (pIVar12->ExtentsX).Max = (double)(~uVar19 & (ulong)dVar11 | (ulong)dVar22 & uVar19);
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= dVar2)) &&
                (dVar2 <= pIVar9->YAxis[iVar5].Range.Max)) goto LAB_001f2734;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
LAB_001f27bd:
            if ((0.0 < dVar2) || ((uVar7 & 0x20) == 0)) {
              dVar22 = pIVar12->ExtentsY[iVar5].Max;
              uVar18 = -(ulong)(dVar2 < pIVar16->Min);
              uVar19 = -(ulong)(dVar22 < dVar2);
              pIVar16->Min = (double)(~uVar18 & (ulong)pIVar16->Min | (ulong)dVar2 & uVar18);
              pIVar12->ExtentsY[iVar5].Max =
                   (double)(~uVar19 & (ulong)dVar22 | (ulong)dVar2 & uVar19);
            }
          }
        }
        else if ((((ulong)ABS(dVar2) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar22))
                && (dVar22 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f27bd;
        dVar21 = dVar21 + dVar23;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001f283a:
            if ((0.0 < dVar21) || ((uVar6 & 0x20) == 0)) {
              dVar2 = (pIVar12->ExtentsX).Min;
              dVar22 = (pIVar12->ExtentsX).Max;
              uVar18 = -(ulong)(dVar21 < dVar2);
              uVar19 = -(ulong)(dVar22 < dVar21);
              (pIVar12->ExtentsX).Min = (double)(~uVar18 & (ulong)dVar2 | (ulong)dVar21 & uVar18);
              (pIVar12->ExtentsX).Max = (double)(~uVar19 & (ulong)dVar22 | (ulong)dVar21 & uVar19);
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= 0.0)) && (0.0 <= pIVar9->YAxis[iVar5].Range.Max)
                ) goto LAB_001f283a;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f28ac:
            dVar2 = pIVar12->ExtentsY[iVar5].Max;
            pIVar16->Min = (double)(-(ulong)(pIVar16->Min <= 0.0) & (ulong)pIVar16->Min);
            pIVar12->ExtentsY[iVar5].Max = (double)(-(ulong)(0.0 <= dVar2) & (ulong)dVar2);
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar9->XAxis).Range.Min <= dVar21)) &&
                (dVar21 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f28ac;
        dVar20 = dVar20 + 1.0;
        iVar17 = iVar17 + 1;
      } while (iVar14 != iVar17);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar3 = (pIVar12->NextItemData).RenderLine;
      iVar15 = 0;
      do {
        dVar1 = *(double *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar15) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar20 = (double)iVar15 + getter->XShift;
          local_38 = PlotToPixels(dVar20 - dVar23,dVar1,-1);
          local_40 = PlotToPixels(dVar20 + dVar23,0.0,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
          iVar14 = getter->Count;
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar14);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}